

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O2

type dlib::
     directory_helper_get_files<dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::file,dlib::memory_manager_stateless_kernel_1<char>>>>
               (data *state,
               queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               *files)

{
  char cVar1;
  char cVar2;
  int iVar3;
  DIR *__dirp;
  int *piVar4;
  dirent *pdVar5;
  ssize_t sVar6;
  listing_error *plVar7;
  string *psVar8;
  char *__rhs;
  allocator local_1141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1140;
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *local_1138;
  string path;
  time_point last_modified;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  stat64 buffer;
  char buf [4096];
  
  local_1138 = &files->
                super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>;
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::clear
            (&files->
              super_queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>);
  if ((state->full_name)._M_string_length == 0) {
    plVar7 = (listing_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)buf,"This directory object currently doesn\'t represent any directory.",
               (allocator *)&buffer);
    directory::listing_error::listing_error(plVar7,(string *)buf);
    __cxa_throw(plVar7,&directory::listing_error::typeinfo,error::~error);
  }
  psVar8 = &state->full_name;
  std::__cxx11::string::string((string *)&path,(string *)psVar8);
  cVar1 = path._M_dataplus._M_p[path._M_string_length - 1];
  cVar2 = directory::get_separator();
  if (cVar1 != cVar2) {
    directory::get_separator();
    std::__cxx11::string::push_back((char)&path);
  }
  local_1140 = psVar8;
  __dirp = opendir((psVar8->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    plVar7 = (listing_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                   "Unable to list the contents of ",local_1140);
    directory::listing_error::listing_error(plVar7,(string *)buf);
    __cxa_throw(plVar7,&directory::listing_error::typeinfo,error::~error);
  }
  piVar4 = __errno_location();
  while( true ) {
    *piVar4 = 0;
    pdVar5 = readdir(__dirp);
    if (pdVar5 == (dirent *)0x0) break;
    __rhs = pdVar5->d_name;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,&path,
                   __rhs);
    iVar3 = stat64((char *)buf._0_8_,(stat64 *)&buffer);
    std::__cxx11::string::~string((string *)buf);
    sVar6 = buffer.st_size;
    if (iVar3 != 0) {
      std::operator+(&local_1108,&path,__rhs);
      sVar6 = readlink(local_1108._M_dataplus._M_p,buf,0x1000);
      std::__cxx11::string::~string((string *)&local_1108);
      if (sVar6 == -1) {
        plVar7 = (listing_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_1108,"Unable to list the contents of ",local_1140);
        directory::listing_error::listing_error(plVar7,&local_1108);
        __cxa_throw(plVar7,&directory::listing_error::typeinfo,error::~error);
      }
    }
    last_modified.__d.__r = (duration)(buffer.st_mtim.tv_sec * 1000000000);
    if ((buffer.st_mode & 0xf000) != 0x4000) {
      std::__cxx11::string::string((string *)&local_1108,__rhs,&local_1141);
      std::operator+(&local_10e8,&path,__rhs);
      file::file((file *)buf,&local_1108,&local_10e8,sVar6,&last_modified);
      std::__cxx11::string::~string((string *)&local_10e8);
      std::__cxx11::string::~string((string *)&local_1108);
      queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
                (local_1138,(file *)buf);
      file::data::~data((data *)buf);
    }
  }
  if (*piVar4 != 0) {
    plVar7 = (listing_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                   "Unable to list the contents of ",local_1140);
    directory::listing_error::listing_error(plVar7,(string *)buf);
    __cxa_throw(plVar7,&directory::listing_error::typeinfo,error::~error);
  }
  do {
    iVar3 = closedir(__dirp);
    if (iVar3 == 0) break;
  } while (*piVar4 == 4);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

typename disable_if<is_std_vector<queue_of_files>,void>::type
    directory_helper_get_files (
        const directory::data& state,
        queue_of_files& files
    ) 
    {
        using namespace std;

        files.clear();
        if (state.full_name.size() == 0)
            throw directory::listing_error("This directory object currently doesn't represent any directory.");

        DIR* ffind = 0;
        struct dirent* data;
        struct stat64 buffer;

        try
        {
            string path = state.full_name;
            // ensure that the path ends with a separator
            if (path[path.size()-1] != directory::get_separator())
                path += directory::get_separator();

            // get a handle to something we can search with
            ffind = opendir(state.full_name.c_str());
            if (ffind == 0)
            {
                throw directory::listing_error("Unable to list the contents of " + state.full_name);
            }

            while(true)
            {
                errno = 0;
                if ( (data = readdir(ffind)) == 0)
                {                    
                    // there was an error or no more files
                    if ( errno == 0)
                    {
                        // there are no more files
                        break;
                    }
                    else
                    {
                        // there was an error
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    }                
                }

                uint64 file_size;
                // get a stat64 structure so we can see if this is a file
                if (::stat64((path+data->d_name).c_str(), &buffer) != 0)
                {
                    // this might be a broken symbolic link.  We can check by calling
                    // readlink and seeing if it finds anything.  
                    char buf[PATH_MAX];
                    ssize_t temp = readlink((path+data->d_name).c_str(),buf,sizeof(buf));
                    if (temp == -1)                    
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    else
                        file_size = static_cast<uint64>(temp);
                }
                else
                {
                    file_size = static_cast<uint64>(buffer.st_size);
                }
                auto last_modified = std::chrono::system_clock::from_time_t(buffer.st_mtime);
#ifdef _BSD_SOURCE 
                last_modified += std::chrono::nanoseconds(buffer.st_atim.tv_nsec);
#endif

                if (S_ISDIR(buffer.st_mode) == 0)
                {
                    // this is actually a file
                    file temp(
                        data->d_name,
                        path+data->d_name,
                        file_size,
                        last_modified,
                        file::private_constructor()
                        );
                    files.enqueue(temp);
                }
            } // while (true)

            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }

        }
        catch (...)
        {
            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }
            files.clear();
            throw;
        }
    }